

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  StructDataBitCount *this_00;
  Builder reader;
  Reader reader_00;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Reader reader_01;
  Builder builder_04;
  Reader reader_02;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Orphan<capnproto_test::capnp::test::TestAllTypes> *other;
  Builder *value;
  Builder *value_00;
  Builder *value_01;
  Builder *value_02;
  Builder *value_03;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffff308;
  undefined8 in_stack_fffffffffffff310;
  Builder local_c08;
  undefined1 local_bf0 [32];
  Reader local_bd0;
  ArrayPtr<const_char> local_b88;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_b78;
  uint local_b44 [2];
  bool local_b39;
  uint local_b38;
  int iStack_b34;
  bool _kj_shouldLog_7;
  bool local_b2d;
  uint local_b2c;
  int iStack_b28;
  bool _kj_shouldLog_6;
  bool local_b21;
  uint local_b20;
  int iStack_b1c;
  bool _kj_shouldLog_5;
  Fault local_b18;
  Fault f_1;
  undefined1 local_af8 [8];
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> l;
  Reader local_aa0;
  ArrayPtr<const_char> local_a58;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_a48;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_a18;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_9f0;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_9c8;
  Orphanage local_9a0;
  undefined1 local_990 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> lorphan;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_958;
  Orphan<capnp::DynamicValue> local_930;
  ArrayPtr<const_char> local_8f8;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_8e8;
  Builder local_8b8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_8a0;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_878;
  Reader local_848;
  ArrayPtr<const_char> local_800;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_7f0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_7c0;
  Orphanage local_798;
  undefined1 local_788 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  BuilderFor<capnp::Text> local_750;
  bool local_731;
  undefined1 local_730 [7];
  bool _kj_shouldLog_4;
  BuilderFor<capnp::Text> local_718;
  Reader local_700;
  Reader local_6f0;
  ArrayPtr<const_char> local_6a8;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_698;
  uint local_668 [4];
  iterator local_658;
  undefined8 local_650;
  Type local_648;
  Builder local_638;
  BuilderFor<capnp::DynamicList> local_620;
  uint local_5e8 [4];
  iterator local_5d8;
  undefined8 local_5d0;
  Type local_5c8;
  Reader local_5b8;
  Reader local_588;
  ReaderFor<capnp::DynamicList> local_568;
  uint local_528 [2];
  bool local_51d;
  uint local_51c;
  uint uStack_518;
  bool _kj_shouldLog_3;
  bool local_511;
  uint local_510;
  uint uStack_50c;
  bool _kj_shouldLog_2;
  bool local_505;
  uint local_504;
  uint uStack_500;
  bool _kj_shouldLog_1;
  bool local_4f9;
  uint local_4f8;
  uint uStack_4f4;
  bool _kj_shouldLog;
  Fault local_4f0;
  Fault f;
  Reader local_4b8;
  undefined1 local_498 [8];
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Type local_348;
  Builder local_338;
  undefined1 local_320 [8];
  BuilderFor<capnp::DynamicList> list;
  Builder local_2e0;
  BuilderFor<capnp::DynamicStruct> local_2c8;
  Schema local_298;
  Reader local_290;
  Reader local_260;
  ReaderFor<capnp::DynamicStruct> local_240;
  Reader local_208;
  Reader local_1d8;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1b8;
  Schema local_188;
  Builder local_180;
  BuilderFor<capnp::DynamicStruct> local_168;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase125 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_180,(Builder *)local_128);
  local_188.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::initAs<capnp::DynamicStruct>
            (&local_168,&local_180,(StructSchema)local_188.raw);
  builder_03.builder.segment = (SegmentBuilder *)local_168.builder.capTable;
  builder_03.schema.super_Schema.raw = (Schema)(Schema)local_168.builder.segment;
  builder_03.builder.capTable = (CapTableBuilder *)local_168.builder.data;
  builder_03.builder.data = local_168.builder.pointers;
  builder_03.builder.pointers = (WirePointer *)local_168.builder._32_8_;
  builder_03.builder.dataSize = (int)in_stack_fffffffffffff308;
  builder_03.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff308 >> 0x20);
  builder_03.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff308 >> 0x30);
  initDynamicTestMessage(builder_03);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_208,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_1d8,&local_208);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1b8,&local_1d8);
  reader_01._reader.capTable = (CapTableReader *)local_1b8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_1b8._reader.capTable;
  reader_01._reader.data = local_1b8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_1b8._reader._32_8_;
  reader_01._reader.dataSize = local_1b8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_1b8._reader._44_2_;
  reader_01._reader._38_2_ = local_1b8._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffff308;
  checkTestMessage(reader_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_290,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_260,&local_290);
  local_298.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Reader::getAs<capnp::DynamicStruct>(&local_240,&local_260,(StructSchema)local_298.raw)
  ;
  reader_02.reader.segment = (SegmentReader *)local_240.reader.capTable;
  reader_02.schema.super_Schema.raw = (Schema)(Schema)local_240.reader.segment;
  reader_02.reader.capTable = (CapTableReader *)local_240.reader.data;
  reader_02.reader.data = local_240.reader.pointers;
  reader_02.reader.pointers = (WirePointer *)local_240.reader._32_8_;
  reader_02.reader.dataSize = local_240.reader.nestingLimit;
  reader_02.reader.pointerCount = local_240.reader._44_2_;
  reader_02.reader._38_2_ = local_240.reader._46_2_;
  reader_02.reader._40_8_ = in_stack_fffffffffffff310;
  checkDynamicTestMessage(reader_02);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2e0,(Builder *)local_128);
  list.builder._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::getAs<capnp::DynamicStruct>
            (&local_2c8,&local_2e0,(StructSchema)list.builder._32_8_);
  builder_04.builder.segment = (SegmentBuilder *)local_2c8.builder.capTable;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)local_2c8.builder.segment;
  builder_04.builder.capTable = (CapTableBuilder *)local_2c8.builder.data;
  builder_04.builder.data = local_2c8.builder.pointers;
  builder_04.builder.pointers = (WirePointer *)local_2c8.builder._32_8_;
  builder_04.builder.dataSize = local_240.reader.nestingLimit;
  builder_04.builder.pointerCount = local_240.reader._44_2_;
  builder_04.builder._38_2_ = local_240.reader._46_2_;
  checkDynamicTestMessage(builder_04);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_338,(Builder *)local_128);
  local_348 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::initAs<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_320,&local_338,(ListSchema)local_348,4);
  DynamicValue::Reader::Reader(&local_390,0x7b);
  DynamicList::Builder::set((Builder *)local_320,0,&local_390);
  DynamicValue::Reader::~Reader(&local_390);
  DynamicValue::Reader::Reader(&local_3d8,0x1c8);
  DynamicList::Builder::set((Builder *)local_320,1,&local_3d8);
  DynamicValue::Reader::~Reader(&local_3d8);
  DynamicValue::Reader::Reader(&local_420,0x315);
  DynamicList::Builder::set((Builder *)local_320,2,&local_420);
  DynamicValue::Reader::~Reader(&local_420);
  DynamicValue::Reader::Reader((Reader *)&list_1.reader.nestingLimit,0x75bcd15);
  DynamicList::Builder::set((Builder *)local_320,3,(Reader *)&list_1.reader.nestingLimit);
  DynamicValue::Reader::~Reader((Reader *)&list_1.reader.nestingLimit);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader((Reader *)&f,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_4b8,(Reader *)&f);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_498,&local_4b8);
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_498);
  if (uVar2 != 4) {
    uStack_4f4 = 4;
    local_4f8 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_498);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_4f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","4u, list.size()",&stack0xfffffffffffffb0c,
               &local_4f8);
    kj::_::Debug::Fault::fatal(&local_4f0);
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,0);
  if (uVar3 != 0x7b) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      uStack_500 = 0x7b;
      local_504 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,0);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x96,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",&stack0xfffffffffffffb00,
                 &local_504);
      local_4f9 = false;
    }
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,1);
  if (uVar3 != 0x1c8) {
    local_505 = kj::_::Debug::shouldLog(ERROR);
    while (local_505 != false) {
      uStack_50c = 0x1c8;
      local_510 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,1);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x97,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",&stack0xfffffffffffffaf4,
                 &local_510);
      local_505 = false;
    }
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,2);
  if (uVar3 != 0x315) {
    local_511 = kj::_::Debug::shouldLog(ERROR);
    while (local_511 != false) {
      uStack_518 = 0x315;
      local_51c = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,2);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x98,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",&stack0xfffffffffffffae8,
                 &local_51c);
      local_511 = false;
    }
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,3);
  if (uVar3 != 0x75bcd15) {
    local_51d = kj::_::Debug::shouldLog(ERROR);
    while (local_51d != false) {
      local_528[1] = 0x75bcd15;
      local_528[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,3);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x99,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
                 (char (*) [43])"failed: expected (123456789u) == (list[3])",local_528 + 1,local_528
                );
      local_51d = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_5b8,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_588,&local_5b8);
  local_5c8 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_568,&local_588,(ListSchema)local_5c8);
  local_5e8[0] = 0x7b;
  local_5e8[1] = 0x1c8;
  local_5e8[2] = 0x315;
  local_5e8[3] = 0x75bcd15;
  local_5d8 = local_5e8;
  local_5d0 = 4;
  expected_00._M_len = 4;
  expected_00._M_array = local_5d8;
  reader_00.schema.elementType.field_4.schema = local_568.schema.elementType.field_4.schema;
  reader_00.schema.elementType.baseType = local_568.schema.elementType.baseType;
  reader_00.schema.elementType.listDepth = local_568.schema.elementType.listDepth;
  reader_00.schema.elementType.isImplicitParam = local_568.schema.elementType.isImplicitParam;
  reader_00.schema.elementType.field_3 = local_568.schema.elementType.field_3;
  reader_00.schema.elementType._6_2_ = local_568.schema.elementType._6_2_;
  reader_00.reader.segment = local_568.reader.segment;
  reader_00.reader.capTable = local_568.reader.capTable;
  reader_00.reader.ptr = local_568.reader.ptr;
  reader_00.reader.elementCount = local_568.reader.elementCount;
  reader_00.reader.step = local_568.reader.step;
  reader_00.reader.structDataSize = local_568.reader.structDataSize;
  reader_00.reader.structPointerCount = local_568.reader.structPointerCount;
  reader_00.reader.elementSize = local_568.reader.elementSize;
  reader_00.reader._39_1_ = local_568.reader._39_1_;
  reader_00.reader.nestingLimit = local_568.reader.nestingLimit;
  reader_00.reader._44_4_ = local_568.reader._44_4_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_00,expected_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_638,(Builder *)local_128);
  local_648 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::getAs<capnp::DynamicList>(&local_620,&local_638,(ListSchema)local_648);
  local_668[0] = 0x7b;
  local_668[1] = 0x1c8;
  local_668[2] = 0x315;
  local_668[3] = 0x75bcd15;
  local_658 = local_668;
  local_650 = 4;
  expected._M_len = 4;
  expected._M_array = local_658;
  reader.schema.elementType.field_4.schema = local_620.schema.elementType.field_4.schema;
  reader.schema.elementType.baseType = local_620.schema.elementType.baseType;
  reader.schema.elementType.listDepth = local_620.schema.elementType.listDepth;
  reader.schema.elementType.isImplicitParam = local_620.schema.elementType.isImplicitParam;
  reader.schema.elementType.field_3 = local_620.schema.elementType.field_3;
  reader.schema.elementType._6_2_ = local_620.schema.elementType._6_2_;
  reader.builder.segment = local_620.builder.segment;
  reader.builder.capTable = local_620.builder.capTable;
  reader.builder.ptr = local_620.builder.ptr;
  reader.builder.elementCount = local_620.builder.elementCount;
  reader.builder.step = local_620.builder.step;
  reader.builder.structDataSize = local_620.builder.structDataSize;
  reader.builder.structPointerCount = local_620.builder.structPointerCount;
  reader.builder.elementSize = local_620.builder.elementSize;
  reader.builder._39_1_ = local_620.builder._39_1_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader,expected);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_698,(capnp *)local_128,value);
  kj::StringPtr::StringPtr((StringPtr *)&local_6a8,"anyPointerField");
  Text::Reader::Reader(&local_700,"foo");
  DynamicValue::Reader::Reader(&local_6f0,&local_700);
  DynamicStruct::Builder::set(&local_698,(StringPtr)local_6a8,&local_6f0);
  DynamicValue::Reader::~Reader(&local_6f0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_730,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::Text>(&local_718,(Builder *)local_730);
  bVar1 = capnp::operator==("foo",&local_718);
  uVar4 = local_620.builder._24_8_;
  if (!bVar1) {
    local_731 = kj::_::Debug::shouldLog(ERROR);
    uVar4 = local_620.builder._24_8_;
    while (local_731 != false) {
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&orphan.builder.location,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnp::Text>(&local_750,(Builder *)&orphan.builder.location);
      kj::_::Debug::log<char_const(&)[70],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xa4,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", \"foo\", root.getAnyPointerField().getAs<Text>()"
                 ,(char (*) [70])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
                 (char (*) [4])0xa4c8db,&local_750);
      local_731 = false;
    }
  }
  local_798 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_788,&local_798);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_7c0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_788);
  builder_00._builder.capTable = (CapTableBuilder *)local_7c0._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_7c0._builder.capTable;
  builder_00._builder.data = local_7c0._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_7c0._builder._32_8_;
  builder_00._builder._32_8_ = uVar4;
  initTestMessage(builder_00);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_7f0,(capnp *)local_128,value_00);
  kj::StringPtr::StringPtr((StringPtr *)&local_800,"anyPointerField");
  Orphan<capnproto_test::capnp::test::TestAllTypes>::getReader
            (&local_878,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_788);
  DynamicValue::Reader::
  Reader<capnproto_test::capnp::test::TestAllTypes::Reader,capnp::DynamicStruct::Reader>
            (&local_848,&local_878);
  DynamicStruct::Builder::set(&local_7f0,(StringPtr)local_800,&local_848);
  DynamicValue::Reader::~Reader(&local_848);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_8b8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_8a0,&local_8b8);
  builder_01._builder.capTable = (CapTableBuilder *)local_8a0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_8a0._builder.capTable;
  builder_01._builder.data = local_8a0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_8a0._builder._32_8_;
  builder_01._builder._32_8_ = uVar4;
  checkTestMessage(builder_01);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_8e8,(capnp *)local_128,value_01);
  kj::StringPtr::StringPtr((StringPtr *)&local_8f8,"anyPointerField");
  other = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_788);
  Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestAllTypes>(&local_930,other);
  DynamicStruct::Builder::adopt(&local_8e8,(StringPtr)local_8f8,&local_930);
  Orphan<capnp::DynamicValue>::~Orphan(&local_930);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&lorphan.builder.location,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_958,(Builder *)&lorphan.builder.location);
  builder_02._builder.capTable = (CapTableBuilder *)local_958._builder.data;
  builder_02._builder.segment = (SegmentBuilder *)local_958._builder.capTable;
  builder_02._builder.data = local_958._builder.pointers;
  builder_02._builder.pointers = (WirePointer *)local_958._builder._32_8_;
  builder_02._builder._32_8_ = uVar4;
  checkTestMessage(builder_02);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_788);
  local_9a0 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990,&local_9a0,3);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_9c8,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_9c8,0,0xc);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_9f0,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_9f0,1,0x22);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_a18,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_a18,2,0x38);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_a48,(capnp *)local_128,value_02);
  kj::StringPtr::StringPtr((StringPtr *)&local_a58,"anyPointerField");
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&l.builder.structDataSize,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990);
  DynamicValue::Reader::
  Reader<capnp::List<unsigned_int,(capnp::Kind)0>::Reader,capnp::DynamicList::Reader>
            (&local_aa0,(Reader *)&l.builder.structDataSize);
  DynamicStruct::Builder::set(&local_a48,(StringPtr)local_a58,&local_aa0);
  DynamicValue::Reader::~Reader(&local_aa0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&f_1,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_af8,(Builder *)&f_1);
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_af8);
  if (uVar2 != 3) {
    iStack_b1c = 3;
    local_b20 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_af8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
              (&local_b18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb7,FAILED,"(3) == (l.size())","3, l.size()",&stack0xfffffffffffff4e4,&local_b20);
    kj::_::Debug::Fault::fatal(&local_b18);
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,0);
  if (uVar3 != 0xc) {
    local_b21 = kj::_::Debug::shouldLog(ERROR);
    while (local_b21 != false) {
      iStack_b28 = 0xc;
      local_b2c = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,0);
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", 12, l[0]",
                 (char (*) [32])"failed: expected (12) == (l[0])",&stack0xfffffffffffff4d8,
                 &local_b2c);
      local_b21 = false;
    }
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,1);
  if (uVar3 != 0x22) {
    local_b2d = kj::_::Debug::shouldLog(ERROR);
    while (local_b2d != false) {
      iStack_b34 = 0x22;
      local_b38 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,1);
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", 34, l[1]",
                 (char (*) [32])"failed: expected (34) == (l[1])",&stack0xfffffffffffff4cc,
                 &local_b38);
      local_b2d = false;
    }
  }
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,2);
  if (uVar3 != 0x38) {
    local_b39 = kj::_::Debug::shouldLog(ERROR);
    while (local_b39 != false) {
      local_b44[1] = 0x38;
      local_b44[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_af8,2)
      ;
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", 56, l[2]",
                 (char (*) [32])"failed: expected (56) == (l[2])",(int *)(local_b44 + 1),local_b44);
      local_b39 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_990);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_b78,(capnp *)local_128,value_03);
  kj::StringPtr::StringPtr((StringPtr *)&local_b88,"anyPointerField");
  Capability::Client::Client((Client *)(local_bf0 + 0x10),(void *)0x0);
  DynamicValue::Reader::Reader<capnp::Capability::Client,capnp::DynamicCapability::Client>
            (&local_bd0,(Client *)(local_bf0 + 0x10));
  DynamicStruct::Builder::set(&local_b78,(StringPtr)local_b88,&local_bd0);
  DynamicValue::Reader::~Reader(&local_bd0);
  Capability::Client::~Client((Client *)(local_bf0 + 0x10));
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_c08,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::Capability>((Builder *)local_bf0);
  Capability::Client::~Client((Client *)local_bf0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}